

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

void proxy_drop(proxy_handle *ph)

{
  void *pvVar1;
  int local_1c;
  int i;
  proxy_priv *priv;
  proxy_handle *ph_local;
  
  pvVar1 = ph->priv;
  proxy_log(ph,LOG_LEVEL_DEBUG,"Dropping all clients...\n");
  for (local_1c = 0; local_1c < *(int *)((long)pvVar1 + 0x838); local_1c = local_1c + 1) {
    proxy_worker_drop((proxy_worker *)(*(long *)((long)pvVar1 + 0x818) + (long)local_1c * 0x50));
  }
  return;
}

Assistant:

void proxy_drop(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	int i;

	proxy_log(ph, LOG_LEVEL_DEBUG, "Dropping all clients...\n");

	for (i = 0; i < priv->num_clients; i++)
		proxy_worker_drop(&priv->client_workers[i]);
}